

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,ForeverLoopStatement *stmt)

{
  DataFlowState *exitState;
  type oldBreakStates;
  DataFlowState local_210;
  SmallVector<slang::analysis::DataFlowState,_2UL> local_170;
  
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            (&local_170,&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            (&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->body,(DataFlowAnalysis *)this);
  DataFlowAnalysis::unreachableState((DataFlowAnalysis *)this);
  exitState = &local_210;
  loopTail(this,exitState,&local_170);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_210,
             (EVP_PKEY_CTX *)exitState);
  SmallVectorBase<slang::analysis::DataFlowState>::cleanup
            (&local_170.super_SmallVectorBase<slang::analysis::DataFlowState>,
             (EVP_PKEY_CTX *)exitState);
  return;
}

Assistant:

void visitStmt(const ForeverLoopStatement& stmt) {
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        // The exit state is by default unreachable but
        // if there are break statements that could change.
        loopTail((DERIVED).unreachableState(), std::move(oldBreakStates));
    }